

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

format_error * __thiscall
boost::runtime::specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
operator<<(format_error *__return_storage_ptr__,
          specific_param_error<boost::runtime::format_error,boost::runtime::input_error> *this,
          basic_cstring<const_char> *val)

{
  string local_40;
  
  unit_test::utils::string_cast<boost::unit_test::basic_cstring<char_const>>
            (&local_40,(utils *)val,val);
  std::__cxx11::string::append((string *)(this + 0x18));
  std::__cxx11::string::~string((string *)&local_40);
  format_error::format_error(__return_storage_ptr__,(format_error *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(T const& val) &&
    {
        this->msg.append( unit_test::utils::string_cast( val ) );

        return reinterpret_cast<Derived&&>(*this);
    }